

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O0

int libtorrent::merkle_num_layers(int leaves)

{
  undefined4 local_10;
  undefined4 local_c;
  int layers;
  int leaves_local;
  
  local_10 = 0;
  for (local_c = leaves; 1 < local_c; local_c = local_c >> 1) {
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

int merkle_num_layers(int leaves)
	{
		// leaves must be a power of 2
		TORRENT_ASSERT((leaves & (leaves - 1)) == 0);
		int layers = 0;
		while (leaves > 1)
		{
			++layers;
			leaves >>= 1;
		}
		return layers;
	}